

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::RecursiveStructMemberIterator::tryConsume
          (RecursiveStructMemberIterator *this,Type *targetType)

{
  bool bVar1;
  undefined8 *in_RDI;
  RecursiveStructMemberIterator *unaff_retaddr;
  ConstantValue *result;
  Type *in_stack_00000030;
  Type *in_stack_00000038;
  ConstantValue *in_stack_ffffffffffffffe0;
  State *local_8;
  
  if (in_RDI[1] == 0) {
    local_8 = (State *)0x0;
  }
  else {
    bVar1 = Type::isUnpackedStruct((Type *)0xa31349);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
      ::operator*((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                   *)(in_RDI + 3));
      ValueSymbol::getType((ValueSymbol *)0xa31399);
      bVar1 = Type::isEquivalent(in_stack_00000038,in_stack_00000030);
      if (bVar1) {
        local_8 = (State *)slang::ConstantValue::at(in_stack_ffffffffffffffe0,(size_t)in_RDI);
        State::next(local_8);
        prepNext(unaff_retaddr);
      }
      else {
        local_8 = (State *)0x0;
      }
    }
    else {
      bVar1 = Type::isEquivalent(in_stack_00000038,in_stack_00000030);
      if (bVar1) {
        in_RDI[1] = 0;
        local_8 = (State *)*in_RDI;
      }
      else {
        local_8 = (State *)0x0;
      }
    }
  }
  return (ConstantValue *)local_8;
}

Assistant:

const ConstantValue* tryConsume(const Type& targetType) {
        if (!curr.type)
            return nullptr;

        if (!curr.type->isUnpackedStruct()) {
            if (!curr.type->isEquivalent(targetType))
                return nullptr;

            curr.type = nullptr;
            return curr.val;
        }

        if (!(*curr.fieldIt)->getType().isEquivalent(targetType))
            return nullptr;

        auto result = &curr.val->at(curr.valIndex);
        curr.next();
        prepNext();
        return result;
    }